

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O0

void flattenDatabase(Database *database,Rules *rules)

{
  pointer *__return_storage_ptr__;
  bool bVar1;
  size_type sVar2;
  pointer pIVar3;
  reference interval;
  undefined1 local_138 [16];
  reverse_iterator it;
  string local_120;
  byte local_fd;
  bool verbose;
  undefined1 local_f0 [8];
  vector<Interval,_std::allocator<Interval>_> expanded;
  Interval latest;
  Rules *rules_local;
  Database *database_local;
  
  __return_storage_ptr__ =
       &expanded.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  getLatestInterval((Interval *)__return_storage_ptr__,database);
  expandLatest((vector<Interval,_std::allocator<Interval>_> *)local_f0,
               (Interval *)__return_storage_ptr__,rules);
  sVar2 = std::vector<Interval,_std::allocator<Interval>_>::size
                    ((vector<Interval,_std::allocator<Interval>_> *)local_f0);
  if (1 < sVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"verbose",(allocator<char> *)((long)&it.current._M_current + 7))
    ;
    bVar1 = Rules::getBoolean(rules,&local_120,false);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it.current._M_current + 7));
    local_fd = bVar1;
    Database::deleteInterval
              (database,(Interval *)
                        &expanded.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    std::vector<Interval,_std::allocator<Interval>_>::rbegin
              ((vector<Interval,_std::allocator<Interval>_> *)(local_138 + 8));
    while( true ) {
      std::vector<Interval,_std::allocator<Interval>_>::rend
                ((vector<Interval,_std::allocator<Interval>_> *)local_138);
      bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>_>
                               *)(local_138 + 8),
                              (reverse_iterator<__gnu_cxx::__normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>_>
                               *)local_138);
      if (!bVar1) break;
      pIVar3 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>_>
               ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>_>
                             *)(local_138 + 8));
      pIVar3->synthetic = false;
      interval = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>_>
                              *)(local_138 + 8));
      Database::addInterval(database,interval,(bool)(local_fd & 1));
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>_>
                    *)(local_138 + 8));
    }
  }
  std::vector<Interval,_std::allocator<Interval>_>::~vector
            ((vector<Interval,_std::allocator<Interval>_> *)local_f0);
  Interval::~Interval((Interval *)
                      &expanded.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void flattenDatabase (Database& database, const Rules& rules)
{
  Interval latest = getLatestInterval (database);
  std::vector <Interval> expanded = expandLatest (latest, rules);

  if (expanded.size () > 1)
  {
    bool verbose = rules.getBoolean ("verbose");
    database.deleteInterval (latest);
    for (auto it = expanded.rbegin (); it != expanded.rend (); ++it)
    {
      it->synthetic = false;
      database.addInterval (*it, verbose);
    }
  }
}